

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::MergeReturnPass::BreakFromConstruct
          (MergeReturnPass *this,BasicBlock *block,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *predicated,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order,
          Instruction *break_merge_inst)

{
  Kind *this_00;
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t uVar4;
  Analysis preserved_analyses;
  uint32_t false_id;
  uint32_t merge_id;
  IRContext *pIVar5;
  Instruction *pIVar6;
  CFG *pCVar7;
  BasicBlock *pBVar8;
  size_type sVar9;
  TypeManager *this_01;
  mapped_type *pmVar10;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar11;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar12;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar13;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  Instruction *local_160;
  undefined1 local_158;
  uint32_t local_14c;
  IRContext *local_148;
  bool local_140;
  uint32_t local_134;
  pointer local_130;
  byte local_128;
  uint32_t local_120;
  uint32_t local_11c;
  uint32_t load_id;
  uint32_t bool_id;
  Bool bool_type;
  InstructionBuilder builder;
  SmallVector<unsigned_int,_2UL> local_b8;
  _Node_iterator_base<unsigned_int,_false> local_90;
  undefined1 local_88;
  uint32_t local_7c;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> local_78;
  undefined1 local_70;
  iterator local_68;
  BasicBlock *local_60;
  BasicBlock *old_body;
  undefined1 local_50 [4];
  uint32_t old_body_id;
  iterator iter;
  BasicBlock *merge_block;
  uint32_t merge_block_id;
  Instruction *break_merge_inst_local;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *predicated_local;
  BasicBlock *block_local;
  MergeReturnPass *this_local;
  
  pIVar5 = Pass::context((Pass *)this);
  IRContext::InvalidateAnalyses(pIVar5,kAnalysisCFG);
  pIVar5 = Pass::context((Pass *)this);
  IRContext::BuildInvalidAnalyses(pIVar5,kAnalysisCFG);
  pIVar6 = BasicBlock::GetLoopMergeInst(block);
  if (pIVar6 != (Instruction *)0x0) {
    pCVar7 = Pass::cfg((Pass *)this);
    pBVar8 = CFG::SplitLoopHeader(pCVar7,block);
    if (pBVar8 == (BasicBlock *)0x0) {
      return false;
    }
  }
  uVar2 = Instruction::GetSingleWordInOperand(break_merge_inst,0);
  pIVar5 = Pass::context((Pass *)this);
  iter.super_iterator.node_ = (iterator)IRContext::get_instr_block(pIVar5,uVar2);
  pIVar6 = BasicBlock::GetLoopMergeInst((BasicBlock *)iter.super_iterator.node_);
  if (pIVar6 != (Instruction *)0x0) {
    pCVar7 = Pass::cfg((Pass *)this);
    CFG::SplitLoopHeader(pCVar7,(BasicBlock *)iter.super_iterator.node_);
  }
  BasicBlock::begin((BasicBlock *)local_50);
  while( true ) {
    pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_50);
    OVar3 = Instruction::opcode(pIVar6);
    if (OVar3 != OpPhi) break;
    InstructionList::iterator::operator++((iterator *)local_50);
  }
  pCVar7 = Pass::cfg((Pass *)this);
  CFG::RemoveSuccessorEdges(pCVar7,block);
  old_body._4_4_ = Pass::TakeNextId((Pass *)this);
  pIVar5 = Pass::context((Pass *)this);
  uVar2 = old_body._4_4_;
  InstructionList::iterator::iterator(&local_68,(iterator *)local_50);
  local_60 = BasicBlock::SplitBasicBlock(block,pIVar5,uVar2,&local_68);
  pVar11 = std::
           unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
           ::insert(predicated,&local_60);
  local_78._M_cur =
       (__node_type *)
       pVar11.first.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur;
  local_70 = pVar11.second;
  local_7c = BasicBlock::id(block);
  sVar9 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->return_blocks_,&local_7c);
  if (sVar9 != 0) {
    pVar12 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert(&this->return_blocks_,(value_type *)((long)&old_body + 4));
    local_90._M_cur =
         (__node_type *)pVar12.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_88 = pVar12.second;
  }
  OVar3 = Instruction::opcode(break_merge_inst);
  if (OVar3 == OpLoopMerge) {
    uVar2 = Instruction::GetSingleWordInOperand(break_merge_inst,1);
    uVar4 = BasicBlock::id(block);
    if (uVar2 == uVar4) {
      builder._28_4_ = BasicBlock::id(local_60);
      init_list._M_len = 1;
      init_list._M_array = (iterator)&builder.field_0x1c;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
      Instruction::SetInOperand(break_merge_inst,1,&local_b8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
      pIVar5 = Pass::context((Pass *)this);
      IRContext::UpdateDefUse(pIVar5,break_merge_inst);
    }
  }
  InsertAfterElement(this,block,local_60,order);
  pIVar5 = Pass::context((Pass *)this);
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&bool_type.super_Type.kind_,pIVar5,block,preserved_analyses);
  analysis::Bool::Bool((Bool *)&load_id);
  pIVar5 = Pass::context((Pass *)this);
  this_01 = IRContext::get_type_mgr(pIVar5);
  uVar2 = analysis::TypeManager::GetId(this_01,(Type *)&load_id);
  local_11c = uVar2;
  if (uVar2 != 0) {
    uVar4 = Instruction::result_id(this->return_flag_);
    this_00 = &bool_type.super_Type.kind_;
    pIVar6 = InstructionBuilder::AddLoad((InstructionBuilder *)this_00,uVar2,uVar4,0);
    uVar2 = Instruction::result_id(pIVar6);
    local_120 = uVar2;
    uVar4 = BasicBlock::id((BasicBlock *)iter.super_iterator.node_);
    false_id = BasicBlock::id(local_60);
    merge_id = BasicBlock::id(local_60);
    InstructionBuilder::AddConditionalBranch
              ((InstructionBuilder *)this_00,uVar2,uVar4,false_id,merge_id,0);
    pmVar10 = std::
              unordered_map<spvtools::opt::BasicBlock_*,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->new_edges_,(key_type *)&iter);
    local_134 = BasicBlock::id(block);
    pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                       (pmVar10,&local_134);
    local_148 = (IRContext *)pVar13.first._M_node;
    local_140 = pVar13.second;
    local_130 = (pointer)local_148;
    local_128 = local_140;
    if (((local_140 ^ 0xffU) & 1) != 0) {
      pmVar10 = std::
                unordered_map<spvtools::opt::BasicBlock_*,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                ::operator[](&this->new_edges_,(key_type *)&iter);
      local_14c = BasicBlock::id(local_60);
      pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert(pmVar10,&local_14c);
      local_160 = (Instruction *)pVar13.first._M_node;
      local_158 = pVar13.second;
    }
    UpdatePhiNodes(this,block,(BasicBlock *)iter.super_iterator.node_);
    pCVar7 = Pass::cfg((Pass *)this);
    CFG::AddEdges(pCVar7,block);
    pCVar7 = Pass::cfg((Pass *)this);
    CFG::RegisterBlock(pCVar7,local_60);
    BasicBlock::begin((BasicBlock *)(local_170 + 8));
    BasicBlock::end((BasicBlock *)local_170);
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_170 + 8),
                              (iterator_template<spvtools::opt::Instruction> *)local_170);
    if (bVar1) {
      BasicBlock::begin((BasicBlock *)(local_180 + 8));
      BasicBlock::end((BasicBlock *)local_180);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_180 + 8),
                                (iterator_template<spvtools::opt::Instruction> *)local_180);
      if (bVar1) {
        analysis::Bool::~Bool((Bool *)&load_id);
        return true;
      }
      __assert_fail("block->begin() != block->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x216,
                    "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
                   );
    }
    __assert_fail("old_body->begin() != old_body->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x215,
                  "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
                 );
  }
  __assert_fail("bool_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0x1fe,
                "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
               );
}

Assistant:

bool MergeReturnPass::BreakFromConstruct(
    BasicBlock* block, std::unordered_set<BasicBlock*>* predicated,
    std::list<BasicBlock*>* order, Instruction* break_merge_inst) {
  // Make sure the CFG is build here.  If we don't then it becomes very hard
  // to know which new blocks need to be updated.
  context()->InvalidateAnalyses(IRContext::kAnalysisCFG);
  context()->BuildInvalidAnalyses(IRContext::kAnalysisCFG);

  // When predicating, be aware of whether this block is a header block, a
  // merge block or both.
  //
  // If this block is a merge block, ensure the appropriate header stays
  // up-to-date with any changes (i.e. points to the pre-header).
  //
  // If this block is a header block, predicate the entire structured
  // subgraph. This can act recursively.

  // If |block| is a loop header, then the back edge must jump to the original
  // code, not the new header.
  if (block->GetLoopMergeInst()) {
    if (cfg()->SplitLoopHeader(block) == nullptr) {
      return false;
    }
  }

  uint32_t merge_block_id = break_merge_inst->GetSingleWordInOperand(0);
  BasicBlock* merge_block = context()->get_instr_block(merge_block_id);
  if (merge_block->GetLoopMergeInst()) {
    cfg()->SplitLoopHeader(merge_block);
  }

  // Leave the phi instructions behind.
  auto iter = block->begin();
  while (iter->opcode() == spv::Op::OpPhi) {
    ++iter;
  }

  // Forget about the edges leaving block.  They will be removed.
  cfg()->RemoveSuccessorEdges(block);

  auto old_body_id = TakeNextId();
  BasicBlock* old_body = block->SplitBasicBlock(context(), old_body_id, iter);
  predicated->insert(old_body);

  // If a return block is being split, mark the new body block also as a return
  // block.
  if (return_blocks_.count(block->id())) {
    return_blocks_.insert(old_body_id);
  }

  // If |block| was a continue target for a loop |old_body| is now the correct
  // continue target.
  if (break_merge_inst->opcode() == spv::Op::OpLoopMerge &&
      break_merge_inst->GetSingleWordInOperand(1) == block->id()) {
    break_merge_inst->SetInOperand(1, {old_body->id()});
    context()->UpdateDefUse(break_merge_inst);
  }

  // Update |order| so old_block will be traversed.
  InsertAfterElement(block, old_body, order);

  // Within the new header we need the following:
  // 1. Load of the return status flag
  // 2. Branch to |merge_block| (true) or old body (false)
  // 3. Update OpPhi instructions in |merge_block|.
  // 4. Update the CFG.
  //
  // Since we are branching to the merge block of the current construct, there
  // is no need for an OpSelectionMerge.

  InstructionBuilder builder(
      context(), block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  // 1. Load of the return status flag
  analysis::Bool bool_type;
  uint32_t bool_id = context()->get_type_mgr()->GetId(&bool_type);
  assert(bool_id != 0);
  uint32_t load_id =
      builder.AddLoad(bool_id, return_flag_->result_id())->result_id();

  // 2. Branch to |merge_block| (true) or |old_body| (false)
  builder.AddConditionalBranch(load_id, merge_block->id(), old_body->id(),
                               old_body->id());

  if (!new_edges_[merge_block].insert(block->id()).second) {
    // It is possible that we already inserted a new edge to the merge block.
    // If so, that edge now goes from |old_body| to |merge_block|.
    new_edges_[merge_block].insert(old_body->id());
  }

  // 3. Update OpPhi instructions in |merge_block|.
  UpdatePhiNodes(block, merge_block);

  // 4. Update the CFG.  We do this after updating the OpPhi instructions
  // because |UpdatePhiNodes| assumes the edge from |block| has not been added
  // to the CFG yet.
  cfg()->AddEdges(block);
  cfg()->RegisterBlock(old_body);

  assert(old_body->begin() != old_body->end());
  assert(block->begin() != block->end());
  return true;
}